

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O2

void crnlib::
     hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
     ::move_node(node *pDst,node *pSrc)

{
  crn::block::block((block *)pDst,(block *)pSrc);
  (pDst->super_value_type).field_0x40 = (pSrc->super_value_type).field_0x40;
  (pDst->super_value_type).field_0x41 = 1;
  (pSrc->super_value_type).field_0x41 = 0;
  return;
}

Assistant:

static inline void move_node(node* pDst, node* pSrc)
        {
            CRNLIB_ASSERT(!pDst->state);

            if (CRNLIB_IS_BITWISE_COPYABLE_OR_MOVABLE(Key) && CRNLIB_IS_BITWISE_COPYABLE_OR_MOVABLE(Value))
            {
                memcpy(pDst, pSrc, sizeof(node));
            }
            else
            {
                if (CRNLIB_IS_BITWISE_COPYABLE_OR_MOVABLE(Key))
                {
                    memcpy(&pDst->first, &pSrc->first, sizeof(Key));
                }
                else
                {
                    scalar_type<Key>::construct(&pDst->first, pSrc->first);
                    scalar_type<Key>::destruct(&pSrc->first);
                }

                if (CRNLIB_IS_BITWISE_COPYABLE_OR_MOVABLE(Value))
                {
                    memcpy(&pDst->second, &pSrc->second, sizeof(Value));
                }
                else
                {
                    scalar_type<Value>::construct(&pDst->second, pSrc->second);
                    scalar_type<Value>::destruct(&pSrc->second);
                }

                pDst->state = cStateValid;
            }

            pSrc->state = cStateInvalid;
        }